

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

void __thiscall
duckdb_parquet::EncryptionAlgorithm::EncryptionAlgorithm
          (EncryptionAlgorithm *this,void **vtt,EncryptionAlgorithm *other217)

{
  _AesGcmV1__isset *p_Var1;
  _AesGcmCtrV1__isset *p_Var2;
  void *pvVar3;
  
  pvVar3 = *vtt;
  *(void **)this = pvVar3;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar3 + -0x30)) = vtt[1];
  *(undefined ***)&this->AES_GCM_V1 = &PTR__AesGcmV1_024b8f30;
  (this->AES_GCM_V1).aad_prefix._M_dataplus._M_p = (pointer)&(this->AES_GCM_V1).aad_prefix.field_2;
  (this->AES_GCM_V1).aad_prefix._M_string_length = 0;
  (this->AES_GCM_V1).aad_prefix.field_2._M_local_buf[0] = '\0';
  (this->AES_GCM_V1).aad_file_unique._M_dataplus._M_p =
       (pointer)&(this->AES_GCM_V1).aad_file_unique.field_2;
  (this->AES_GCM_V1).aad_file_unique._M_string_length = 0;
  (this->AES_GCM_V1).aad_file_unique.field_2._M_local_buf[0] = '\0';
  (this->AES_GCM_V1).supply_aad_prefix = false;
  p_Var1 = &(this->AES_GCM_V1).__isset;
  *p_Var1 = (_AesGcmV1__isset)((byte)*p_Var1 & 0xf8);
  *(undefined ***)&this->AES_GCM_CTR_V1 = &PTR__AesGcmCtrV1_024b8f98;
  (this->AES_GCM_CTR_V1).aad_prefix._M_dataplus._M_p =
       (pointer)&(this->AES_GCM_CTR_V1).aad_prefix.field_2;
  (this->AES_GCM_CTR_V1).aad_prefix._M_string_length = 0;
  (this->AES_GCM_CTR_V1).aad_prefix.field_2._M_local_buf[0] = '\0';
  (this->AES_GCM_CTR_V1).aad_file_unique._M_dataplus._M_p =
       (pointer)&(this->AES_GCM_CTR_V1).aad_file_unique.field_2;
  (this->AES_GCM_CTR_V1).aad_file_unique._M_string_length = 0;
  (this->AES_GCM_CTR_V1).aad_file_unique.field_2._M_local_buf[0] = '\0';
  (this->AES_GCM_CTR_V1).supply_aad_prefix = false;
  p_Var2 = &(this->AES_GCM_CTR_V1).__isset;
  *p_Var2 = (_AesGcmCtrV1__isset)((byte)*p_Var2 & 0xf8);
  this->__isset = (_EncryptionAlgorithm__isset)((byte)this->__isset & 0xfc);
  std::__cxx11::string::_M_assign((string *)&(this->AES_GCM_V1).aad_prefix);
  std::__cxx11::string::_M_assign((string *)&(this->AES_GCM_V1).aad_file_unique);
  (this->AES_GCM_V1).supply_aad_prefix = (other217->AES_GCM_V1).supply_aad_prefix;
  (this->AES_GCM_V1).__isset = (other217->AES_GCM_V1).__isset;
  std::__cxx11::string::_M_assign((string *)&(this->AES_GCM_CTR_V1).aad_prefix);
  std::__cxx11::string::_M_assign((string *)&(this->AES_GCM_CTR_V1).aad_file_unique);
  (this->AES_GCM_CTR_V1).supply_aad_prefix = (other217->AES_GCM_CTR_V1).supply_aad_prefix;
  (this->AES_GCM_CTR_V1).__isset = (other217->AES_GCM_CTR_V1).__isset;
  this->__isset = other217->__isset;
  return;
}

Assistant:

EncryptionAlgorithm::EncryptionAlgorithm(const EncryptionAlgorithm& other217) {
  AES_GCM_V1 = other217.AES_GCM_V1;
  AES_GCM_CTR_V1 = other217.AES_GCM_CTR_V1;
  __isset = other217.__isset;
}